

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_ScrollParchment(double dmapx,double dmapy)

{
  FTexture *pFVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = mapxstart - dmapx * scale_mtof;
  dVar2 = mapystart - dmapy * scale_mtof;
  dVar3 = 40000.0;
  if (dVar4 <= 40000.0) {
    dVar3 = dVar4;
  }
  mapxstart = (double)(~-(ulong)(-40000.0 < dVar4) & 0xc0e3880000000000 |
                      (ulong)dVar3 & -(ulong)(-40000.0 < dVar4));
  dVar3 = 40000.0;
  if (dVar2 <= 40000.0) {
    dVar3 = dVar2;
  }
  mapystart = (double)(~-(ulong)(-40000.0 < dVar2) & 0xc0e3880000000000 |
                      (ulong)dVar3 & -(ulong)(-40000.0 < dVar2));
  if (((0 < (long)mapback.texnum) && ((uint)mapback.texnum < TexMan.Textures.Count)) &&
     (pFVar1 = TexMan.Textures.Array[mapback.texnum].Texture, pFVar1 != (FTexture *)0x0)) {
    dVar3 = (double)pFVar1->Width;
    for (; 0.0 < mapxstart; mapxstart = mapxstart - dVar3) {
    }
    for (; mapxstart <= (double)(int)-(uint)pFVar1->Width; mapxstart = mapxstart + dVar3) {
    }
    dVar3 = (double)pFVar1->Height;
    for (; 0.0 < mapystart; mapystart = mapystart - dVar3) {
    }
    for (; mapystart <= (double)(int)-(uint)pFVar1->Height; mapystart = mapystart + dVar3) {
    }
  }
  return;
}

Assistant:

static void AM_ScrollParchment (double dmapx, double dmapy)
{
	mapxstart = mapxstart - dmapx * scale_mtof;
	mapystart = mapystart - dmapy * scale_mtof;

	mapxstart = clamp(mapxstart, -40000., 40000.);
	mapystart = clamp(mapystart, -40000., 40000.);

	if (mapback.isValid())
	{
		FTexture *backtex = TexMan[mapback];

		if (backtex != NULL)
		{
			int pwidth = backtex->GetWidth();
			int pheight = backtex->GetHeight();

			while(mapxstart > 0)
				mapxstart -= pwidth;
			while(mapxstart <= -pwidth)
				mapxstart += pwidth;
			while(mapystart > 0)
				mapystart -= pheight;
			while(mapystart <= -pheight)
				mapystart += pheight;
		}
	}
}